

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_red.c
# Opt level: O0

void ppRedTrinomial(word *a,pp_trinom_st *p)

{
  ulong uVar1;
  byte bVar2;
  sbyte sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong local_48;
  size_t n;
  size_t kw;
  size_t kb;
  size_t mw;
  size_t mb;
  word hi;
  pp_trinom_st *p_local;
  word *a_local;
  
  bVar2 = (byte)p->m & 0x3f;
  uVar4 = p->m >> 6;
  uVar5 = p->m - p->k & 0x3f;
  uVar6 = p->m - p->k >> 6;
  n = (p->m + 0x3f >> 6) << 1;
  while (n = n - 1, sVar3 = (sbyte)uVar5, uVar4 < n) {
    uVar1 = a[n];
    lVar7 = (n - uVar4) + -1;
    a[lVar7] = uVar1 << (0x40 - bVar2 & 0x3f) ^ a[lVar7];
    a[n - uVar4] = uVar1 >> bVar2 ^ a[n - uVar4];
    if (uVar5 == 0) {
      local_48 = 0;
    }
    else {
      local_48 = uVar1 << (0x40U - sVar3 & 0x3f);
    }
    lVar7 = (n - uVar6) + -1;
    a[lVar7] = local_48 ^ a[lVar7];
    a[n - uVar6] = uVar1 >> sVar3 ^ a[n - uVar6];
  }
  uVar4 = a[n];
  *a = uVar4 >> bVar2 ^ *a;
  uVar4 = (uVar4 >> bVar2) << bVar2;
  if ((uVar6 < n) && (uVar5 != 0)) {
    lVar7 = (n - uVar6) + -1;
    a[lVar7] = uVar4 << (0x40U - sVar3 & 0x3f) ^ a[lVar7];
  }
  a[n - uVar6] = uVar4 >> sVar3 ^ a[n - uVar6];
  a[n] = uVar4 ^ a[n];
  return;
}

Assistant:

void ppRedTrinomial(word a[], const pp_trinom_st* p)
{
	register word hi;
	size_t mb, mw, kb, kw;
	size_t n;
	// pre
	ASSERT(memIsValid(p, sizeof(pp_trinom_st)));
	ASSERT(wwIsValid(a, 2 * W_OF_B(p->m)));
	ASSERT(p->m % 8 != 0);
	ASSERT(p->m > p->k && p->k > 0);
	ASSERT(p->m - p->k >= B_PER_W);
	// разбор трехчлена
	mb = p->m % B_PER_W;
	mw = p->m / B_PER_W;
	kb = (p->m - p->k) % B_PER_W;
	kw = (p->m - p->k) / B_PER_W;
	// обработать старшие слова
	for (n = 2 * W_OF_B(p->m); --n > mw;)
	{
		hi = a[n];
		a[n - mw - 1] ^= hi << (B_PER_W - mb);
		a[n - mw] ^= hi >> mb;
		a[n - kw - 1] ^= kb ? hi << (B_PER_W - kb) : 0;
		a[n - kw] ^= hi >> kb;
	}
	// слово, на которое попадает моном x^m
	ASSERT(n == mw);
	hi = a[n] >> mb;
	a[0] ^= hi;
	hi <<= mb;
	if (kw < n && kb)
		a[n - kw - 1] ^= hi << (B_PER_W - kb);
	a[n - kw] ^= hi >> kb;
	a[n] ^= hi;
	// очистка
	hi = 0;
}